

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSocket.cpp
# Opt level: O1

bool __thiscall brynet::net::DataSocket::checkRead(DataSocket *this)

{
  return true;
}

Assistant:

bool    DataSocket::checkRead()
{
    bool check_ret = true;
#ifdef PLATFORM_WINDOWS
    static CHAR temp[] = { 0 };
    static WSABUF  in_buf = { 0, temp };

    if (mPostRecvCheck)
    {
        return check_ret;
    }

    DWORD   dwBytes = 0;
    DWORD   flag = 0;
    int ret = WSARecv(mSocket->getFD(), &in_buf, 1, &dwBytes, &flag, &(mOvlRecv.base), 0);
    if (ret == -1)
    {
        check_ret = (sErrno == WSA_IO_PENDING);
    }

    if (check_ret)
    {
        mPostRecvCheck = true;
    }
#endif
    
    return check_ret;
}